

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O0

int Abc_SclFindBestCell(SC_Man *p,Abc_Obj_t *pObj,Vec_Int_t *vRecalcs,Vec_Int_t *vEvals,int Notches,
                       int DelayGap,float *pGainBest)

{
  SC_Cell *pOld;
  float fVar1;
  int local_54;
  int local_50;
  int NoChange;
  int gateBest;
  int k;
  float dGainBest;
  float dGain;
  SC_Cell *pCellNew;
  SC_Cell *pCellOld;
  int DelayGap_local;
  int Notches_local;
  Vec_Int_t *vEvals_local;
  Vec_Int_t *vRecalcs_local;
  Abc_Obj_t *pObj_local;
  SC_Man *p_local;
  
  local_54 = 0;
  pOld = Abc_SclObjCell(pObj);
  Abc_SclConeStore(p,vRecalcs);
  Abc_SclEvalStore(p,vEvals);
  Abc_SclLoadStore(p,pObj);
  local_50 = -1;
  gateBest = (int)(float)-DelayGap;
  _dGainBest = pOld;
  for (NoChange = 0; NoChange == 0 || _dGainBest != pOld; NoChange = NoChange + 1) {
    if (_dGainBest != pOld) {
      if (Notches < NoChange) break;
      Abc_SclObjSetCell(pObj,_dGainBest);
      Abc_SclUpdateLoad(p,pObj,pOld,_dGainBest);
      Abc_SclTimeCone(p,vRecalcs);
      Abc_SclObjSetCell(pObj,pOld);
      Abc_SclLoadRestore(p,pObj);
      fVar1 = Abc_SclEvalPerform(p,vEvals);
      if (fVar1 <= (float)gateBest) {
        if (local_54 != 0) {
          local_54 = local_54 + 1;
        }
      }
      else {
        local_50 = _dGainBest->Id;
        local_54 = 1;
        gateBest = (int)fVar1;
      }
      if (local_54 == 4) break;
    }
    _dGainBest = _dGainBest->pNext;
  }
  Abc_SclObjSetCell(pObj,pOld);
  Abc_SclConeRestore(p,vRecalcs);
  *pGainBest = (float)gateBest;
  return local_50;
}

Assistant:

int Abc_SclFindBestCell( SC_Man * p, Abc_Obj_t * pObj, Vec_Int_t * vRecalcs, Vec_Int_t * vEvals, int Notches, int DelayGap, float * pGainBest )
{
    SC_Cell * pCellOld, * pCellNew;
    float dGain, dGainBest;
    int k, gateBest, NoChange = 0;
    // save old gate, timing, fanin load
    pCellOld = Abc_SclObjCell( pObj );
    Abc_SclConeStore( p, vRecalcs );
    Abc_SclEvalStore( p, vEvals );
    Abc_SclLoadStore( p, pObj );
    // try different gate sizes for this node
    gateBest = -1;
    dGainBest = -DelayGap;
    SC_RingForEachCell( pCellOld, pCellNew, k )
    {
        if ( pCellNew == pCellOld )
            continue;
        if ( k > Notches )
            break;
        // set new cell
        Abc_SclObjSetCell( pObj, pCellNew );
        Abc_SclUpdateLoad( p, pObj, pCellOld, pCellNew );
        // recompute timing
        Abc_SclTimeCone( p, vRecalcs );
        // set old cell
        Abc_SclObjSetCell( pObj, pCellOld );
        Abc_SclLoadRestore( p, pObj );
        // save best gain
        dGain = Abc_SclEvalPerform( p, vEvals );
        if ( dGainBest < dGain )
        {
            dGainBest = dGain;
            gateBest = pCellNew->Id;
            NoChange = 1;
        }
        else if ( NoChange )
            NoChange++;
        if ( NoChange == 4 )
            break;
//        printf( "%.2f ", dGain );
    }
//    printf( "Best = %.2f   ", dGainBest );
//    printf( "\n" );
    // put back old cell and timing
    Abc_SclObjSetCell( pObj, pCellOld );
    Abc_SclConeRestore( p, vRecalcs );
    *pGainBest = dGainBest;
    return gateBest;
}